

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Stage::GetPrimAtPath_abi_cxx11_
          (expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Stage *this,Path *path)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  *this_00;
  pointer pPVar1;
  iterator iVar2;
  value_type *ppPVar3;
  mapped_type *ppPVar4;
  value_type pPVar5;
  pointer parent;
  optional<const_tinyusdz::Prim_*> pv;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (path->_valid == false) {
    local_b0._M_dataplus._M_p = "Path is invalid.\n";
LAB_002671b4:
    nonstd::expected_lite::
    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_b0);
    return __return_storage_ptr__;
  }
  if (((path->_prim_part)._M_string_length == 0) || (*(path->_prim_part)._M_dataplus._M_p != '/')) {
    local_b0._M_dataplus._M_p = "Relative path is TODO.\n";
    goto LAB_002671b4;
  }
  this_00 = &this->_prim_path_cache;
  if (this->_dirty == true) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::clear(&this_00->_M_t);
    this->_dirty = false;
  }
  else {
    iVar2 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
            ::find(&this_00->_M_t,(key_type *)path);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      pPVar5 = *(value_type *)(iVar2._M_node + 2);
      goto LAB_00267314;
    }
  }
  parent = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (parent == pPVar1) {
      Path::full_path_name_abi_cxx11_(&local_50,path);
      ::std::operator+(&local_70,"Cannot find path <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50);
      ::std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70,"> in the Stage.\n");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        local_b0.field_2._8_8_ = local_90.field_2._8_8_;
      }
      else {
        local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_b0._M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      nonstd::expected_lite::
      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_50);
    anon_unknown_28::GetPrimAtPathRec
              ((optional<const_tinyusdz::Prim_*> *)&local_70,parent,&local_b0,path,0);
    local_90._M_dataplus._M_p._0_1_ = (char)local_70._M_dataplus._M_p;
    if ((char)local_70._M_dataplus._M_p == '\x01') break;
    ::std::__cxx11::string::_M_dispose();
    parent = parent + 1;
  }
  local_90._M_string_length = local_70._M_string_length;
  ::std::__cxx11::string::_M_dispose();
  ppPVar3 = nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                      ((optional<const_tinyusdz::Prim_*> *)&local_90);
  pPVar5 = *ppPVar3;
  ppPVar4 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
            ::operator[](this_00,(key_type *)path);
  *ppPVar4 = pPVar5;
  ppPVar3 = nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                      ((optional<const_tinyusdz::Prim_*> *)&local_90);
  (__return_storage_ptr__->contained).
  super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  pPVar5 = *ppPVar3;
LAB_00267314:
  (__return_storage_ptr__->contained).
  super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = pPVar5;
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<const Prim *, std::string> Stage::GetPrimAtPath(
    const Path &path) const {
  DCOUT("GetPrimAtPath : " << path.prim_part() << "(input path: " << path
                           << ")");

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    return nonstd::make_unexpected("Path is invalid.\n");
  }

  if (path.is_relative_path()) {
    DCOUT("Relative path is todo.");
    // TODO:
    return nonstd::make_unexpected("Relative path is TODO.\n");
  }

  if (!path.is_absolute_path()) {
    DCOUT("Not absolute path.");
    return nonstd::make_unexpected(
        "Path is not absolute. Non-absolute Path is TODO.\n");
  }

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _prim_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_path_cache.find(path.prim_part());
    if (ret != _prim_path_cache.end()) {
      DCOUT("Found cache.");
      return ret->second;
    }
  }


  // Brute-force search.
  for (const auto &parent : _root_nodes) {
    if (auto pv =
            GetPrimAtPathRec(&parent, /* root */ "", path, /* depth */ 0)) {
      // Add to cache.
      // Assume pointer address does not change unless dirty state.
      _prim_path_cache[path.prim_part()] = pv.value();
      return pv.value();
    }
  }

  DCOUT("Not found.");
  return nonstd::make_unexpected("Cannot find path <" + path.full_path_name() +
                                 "> in the Stage.\n");
}